

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConeShape.h
# Opt level: O2

char * __thiscall
cbtConeShape::serialize(cbtConeShape *this,void *dataBuffer,cbtSerializer *serializer)

{
  cbtConvexInternalShape::serialize(&this->super_cbtConvexInternalShape,dataBuffer,serializer);
  *(int *)((long)dataBuffer + 0x38) = this->m_coneIndices[1];
  *(undefined4 *)((long)dataBuffer + 0x3c) = 0;
  return "cbtConeShapeData";
}

Assistant:

SIMD_FORCE_INLINE const char* cbtConeShape::serialize(void* dataBuffer, cbtSerializer* serializer) const
{
	cbtConeShapeData* shapeData = (cbtConeShapeData*)dataBuffer;

	cbtConvexInternalShape::serialize(&shapeData->m_convexInternalShapeData, serializer);

	shapeData->m_upIndex = m_coneIndices[1];

	// Fill padding with zeros to appease msan.
	shapeData->m_padding[0] = 0;
	shapeData->m_padding[1] = 0;
	shapeData->m_padding[2] = 0;
	shapeData->m_padding[3] = 0;

	return "cbtConeShapeData";
}